

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pbrt::ParameterDictionary::
lookupArray<std::__cxx11::string,pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>const&(*)(pbrt::ParsedParameter_const&),std::__cxx11::string(*)(std::__cxx11::string_const*,pbrt::FileLoc_const*)>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ParameterDictionary *this,string *name,ParameterType type,
          char *typeName,int nPerItem,
          _func_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_ParsedParameter_ptr
          *getValues,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_FileLoc_ptr
          *convert)

{
  string *__lhs;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *__lhs_00;
  ulong uVar3;
  __type_conflict _Var4;
  bool bVar5;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int local_5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar6 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar6 = paVar1;
  }
  lVar9 = 0;
  while( true ) {
    if (sVar2 << 3 == lVar9) {
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      return __return_storage_ptr__;
    }
    __lhs_00 = *(ParsedParameter **)((long)paVar6 + lVar9);
    __lhs = &__lhs_00->name;
    _Var4 = std::operator==(__lhs,name);
    if ((_Var4) && (bVar5 = std::operator==(&__lhs_00->type,typeName), bVar5)) break;
    lVar9 = lVar9 + 8;
  }
  local_58 = (*getValues)(__lhs_00);
  uVar3 = local_58->nStored;
  local_5c = nPerItem;
  if (uVar3 != 0) {
    uVar8 = (ulong)nPerItem;
    if (uVar3 % uVar8 == 0) {
      __lhs_00->lookedUp = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__return_storage_ptr__,uVar3 / uVar8,(allocator_type *)&local_50);
      lVar9 = 0;
      lVar10 = 0;
      for (uVar7 = 0; uVar7 < uVar3 / uVar8; uVar7 = uVar7 + 1) {
        (*convert)(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(local_58->ptr->_M_dataplus)._M_p + lVar9),&__lhs_00->loc);
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&(((__return_storage_ptr__->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10
                   ),(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = lVar10 + 0x20;
        lVar9 = lVar9 + uVar8 * 0x20;
      }
      return __return_storage_ptr__;
    }
    ErrorExit<std::__cxx11::string_const&,int&>
              (&__lhs_00->loc,"Number of values provided for \"%s\" not a multiple of %d",__lhs,
               &local_5c);
  }
  ErrorExit<std::__cxx11::string_const&>(&__lhs_00->loc,"No values provided for \"%s\".",__lhs);
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}